

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateErrorHandlerCallback
               (HelicsFederate fed,_func_void_int_char_ptr_void_ptr *errorHandler,void *userdata,
               HelicsError *err)

{
  Federate *callback;
  tuple<helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
  in_RSI;
  Federate *fedptr;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff58;
  Federate *in_stack_ffffffffffffff60;
  Federate *this;
  anon_class_16_2_364c4e2c *in_stack_ffffffffffffff68;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff70;
  undefined8 local_28;
  __uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
  .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl =
       (tuple<helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
        )(tuple<helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
          )in_RSI.
           super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
           .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
  callback = getFed(in_stack_ffffffffffffff70,(HelicsError *)in_stack_ffffffffffffff68);
  if (callback != (Federate *)0x0) {
    local_28 = callback;
    if ((__uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
         )local_10._M_t.
          super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
          .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
         )0x0) {
      std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::function
                ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
                 in_stack_ffffffffffffff60);
      helics::Federate::setErrorHandlerCallback(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
      ;
      std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
                ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
                 0x1bd5f6);
    }
    else {
      this = (Federate *)&stack0xffffffffffffff88;
      std::function<void(int,std::basic_string_view<char,std::char_traits<char>>)>::
      function<helicsFederateErrorHandlerCallback::__0,void>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      helics::Federate::setErrorHandlerCallback
                (this,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *
                      )callback);
      std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
                ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
                 0x1bd669);
    }
  }
  return;
}

Assistant:

void helicsFederateErrorHandlerCallback(HelicsFederate fed,
                                        void (*errorHandler)(int errorCode, const char* errorString, void* userdata),
                                        void* userdata,
                                        HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (errorHandler == nullptr) {
            fedptr->setErrorHandlerCallback({});
        } else {
            fedptr->setErrorHandlerCallback([errorHandler, userdata](int errorCode, std::string_view errorMessage) {
                // string is to ensure we have a null terminator
                const std::string eMessage(errorMessage);
                errorHandler(errorCode, eMessage.c_str(), userdata);
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}